

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::SetDragDropPayload(char *type,void *data,size_t data_size,ImGuiCond cond)

{
  int *piVar1;
  ImGuiContext *pIVar2;
  uchar *puVar3;
  int iVar4;
  uchar *puVar5;
  int iVar6;
  int iVar7;
  
  pIVar2 = GImGui;
  if ((1 < (uint)cond) && ((GImGui->DragDropPayload).DataFrameCount != -1)) goto LAB_0013b92a;
  strncpy((GImGui->DragDropPayload).DataType,type,0x20);
  (pIVar2->DragDropPayload).DataType[0x20] = '\0';
  iVar4 = (pIVar2->DragDropPayloadBufHeap).Capacity;
  if (iVar4 < 0) {
    iVar4 = iVar4 / 2 + iVar4;
    iVar7 = 0;
    if (0 < iVar4) {
      iVar7 = iVar4;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    puVar3 = (uchar *)(*GImAllocatorAllocFunc)((size_t)iVar7,GImAllocatorUserData);
    puVar5 = (pIVar2->DragDropPayloadBufHeap).Data;
    if (puVar5 != (uchar *)0x0) {
      memcpy(puVar3,puVar5,(long)(pIVar2->DragDropPayloadBufHeap).Size);
      puVar5 = (pIVar2->DragDropPayloadBufHeap).Data;
      if ((puVar5 != (uchar *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar5,GImAllocatorUserData);
    }
    (pIVar2->DragDropPayloadBufHeap).Data = puVar3;
    (pIVar2->DragDropPayloadBufHeap).Capacity = iVar7;
  }
  (pIVar2->DragDropPayloadBufHeap).Size = 0;
  iVar4 = (int)data_size;
  if (data_size < 0x11) {
    if (data_size != 0) {
      puVar5 = pIVar2->DragDropPayloadBufLocal;
      pIVar2->DragDropPayloadBufLocal[0] = '\0';
      pIVar2->DragDropPayloadBufLocal[1] = '\0';
      pIVar2->DragDropPayloadBufLocal[2] = '\0';
      pIVar2->DragDropPayloadBufLocal[3] = '\0';
      pIVar2->DragDropPayloadBufLocal[4] = '\0';
      pIVar2->DragDropPayloadBufLocal[5] = '\0';
      pIVar2->DragDropPayloadBufLocal[6] = '\0';
      pIVar2->DragDropPayloadBufLocal[7] = '\0';
      pIVar2->DragDropPayloadBufLocal[8] = '\0';
      pIVar2->DragDropPayloadBufLocal[9] = '\0';
      pIVar2->DragDropPayloadBufLocal[10] = '\0';
      pIVar2->DragDropPayloadBufLocal[0xb] = '\0';
      pIVar2->DragDropPayloadBufLocal[0xc] = '\0';
      pIVar2->DragDropPayloadBufLocal[0xd] = '\0';
      pIVar2->DragDropPayloadBufLocal[0xe] = '\0';
      pIVar2->DragDropPayloadBufLocal[0xf] = '\0';
      goto LAB_0013b911;
    }
    (pIVar2->DragDropPayload).Data = (void *)0x0;
  }
  else {
    iVar7 = (pIVar2->DragDropPayloadBufHeap).Capacity;
    if (iVar7 < iVar4) {
      if (iVar7 == 0) {
        iVar6 = 8;
      }
      else {
        iVar6 = iVar7 / 2 + iVar7;
      }
      if (iVar6 <= iVar4) {
        iVar6 = iVar4;
      }
      if (iVar7 < iVar6) {
        if (GImGui != (ImGuiContext *)0x0) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + 1;
        }
        puVar3 = (uchar *)(*GImAllocatorAllocFunc)((long)iVar6,GImAllocatorUserData);
        puVar5 = (pIVar2->DragDropPayloadBufHeap).Data;
        if (puVar5 != (uchar *)0x0) {
          memcpy(puVar3,puVar5,(long)(pIVar2->DragDropPayloadBufHeap).Size);
          puVar5 = (pIVar2->DragDropPayloadBufHeap).Data;
          if ((puVar5 != (uchar *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
            piVar1 = &(GImGui->IO).MetricsActiveAllocations;
            *piVar1 = *piVar1 + -1;
          }
          (*GImAllocatorFreeFunc)(puVar5,GImAllocatorUserData);
        }
        (pIVar2->DragDropPayloadBufHeap).Data = puVar3;
        (pIVar2->DragDropPayloadBufHeap).Capacity = iVar6;
      }
    }
    (pIVar2->DragDropPayloadBufHeap).Size = iVar4;
    puVar5 = (pIVar2->DragDropPayloadBufHeap).Data;
LAB_0013b911:
    (pIVar2->DragDropPayload).Data = puVar5;
    memcpy(puVar5,data,data_size);
  }
  (pIVar2->DragDropPayload).DataSize = iVar4;
LAB_0013b92a:
  iVar4 = pIVar2->FrameCount;
  (pIVar2->DragDropPayload).DataFrameCount = iVar4;
  return pIVar2->DragDropAcceptFrameCount == iVar4 + -1 || pIVar2->DragDropAcceptFrameCount == iVar4
  ;
}

Assistant:

bool ImGui::SetDragDropPayload(const char* type, const void* data, size_t data_size, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    ImGuiPayload& payload = g.DragDropPayload;
    if (cond == 0)
        cond = ImGuiCond_Always;

    IM_ASSERT(type != NULL);
    IM_ASSERT(strlen(type) < IM_ARRAYSIZE(payload.DataType) && "Payload type can be at most 32 characters long");
    IM_ASSERT((data != NULL && data_size > 0) || (data == NULL && data_size == 0));
    IM_ASSERT(cond == ImGuiCond_Always || cond == ImGuiCond_Once);
    IM_ASSERT(payload.SourceId != 0);                               // Not called between BeginDragDropSource() and EndDragDropSource()

    if (cond == ImGuiCond_Always || payload.DataFrameCount == -1)
    {
        // Copy payload
        ImStrncpy(payload.DataType, type, IM_ARRAYSIZE(payload.DataType));
        g.DragDropPayloadBufHeap.resize(0);
        if (data_size > sizeof(g.DragDropPayloadBufLocal))
        {
            // Store in heap
            g.DragDropPayloadBufHeap.resize((int)data_size);
            payload.Data = g.DragDropPayloadBufHeap.Data;
            memcpy(payload.Data, data, data_size);
        }
        else if (data_size > 0)
        {
            // Store locally
            memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
            payload.Data = g.DragDropPayloadBufLocal;
            memcpy(payload.Data, data, data_size);
        }
        else
        {
            payload.Data = NULL;
        }
        payload.DataSize = (int)data_size;
    }
    payload.DataFrameCount = g.FrameCount;

    return (g.DragDropAcceptFrameCount == g.FrameCount) || (g.DragDropAcceptFrameCount == g.FrameCount - 1);
}